

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O3

void nite::dropFrame(void)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  size_t in_RDX;
  size_t extraout_RDX;
  nite *this;
  long lVar5;
  string local_80;
  string local_60;
  long *local_40;
  long local_38;
  long local_30;
  long lStack_28;
  
  lVar5 = 0;
  this = (nite *)0x0;
  do {
    lVar1 = *(long *)((long)&targets[0].objects.
                             super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish + lVar5) -
            *(long *)((long)&targets[0].objects.
                             super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar5);
    if (lVar1 != 0) {
      this = this + (lVar1 >> 3);
      RenderTarget::clear((RenderTarget *)
                          ((long)&targets[0].objects.
                                  super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar5));
      in_RDX = extraout_RDX;
    }
    lVar5 = lVar5 + 0x50;
  } while (lVar5 != 0x3c0);
  toStr_abi_cxx11_(&local_80,this,in_RDX);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,0x244557);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_30 = *plVar3;
    lStack_28 = plVar2[3];
    local_40 = &local_30;
  }
  else {
    local_30 = *plVar3;
    local_40 = (long *)*plVar2;
  }
  local_38 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_40);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_60.field_2._M_allocated_capacity = *psVar4;
    local_60.field_2._8_8_ = plVar2[3];
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  }
  else {
    local_60.field_2._M_allocated_capacity = *psVar4;
    local_60._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_60._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  print(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (local_40 != &local_30) {
    operator_delete(local_40);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  return;
}

Assistant:

void nite::dropFrame(){
	size_t total = 0;
  for(int c = 0; c < RenderTargetNumber; ++c){
		if(targets[c].objects.size() == 0) continue;
		total += targets[c].objects.size();
    	targets[c].clear();
  }
	nite::print("drop frame request: "+nite::toStr(total)+" objects");
}